

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::DescriptorProto::_InternalSerialize
          (DescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  string *psVar2;
  MessageOptions *this_00;
  size_t __n;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  Type *pTVar6;
  Type *this_01;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  Type *s;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.DescriptorProto.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar1 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->field_).super_RepeatedPtrFieldBase,iVar9);
      *target = '\x12';
      uVar8 = (pTVar6->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            puVar10 = puVar11 + 1;
            bVar4 = 0x3fff < uVar8;
            uVar8 = uVar7;
          } while (bVar4);
          *puVar11 = (uint8)uVar7;
        }
      }
      target = FieldDescriptorProto::_InternalSerialize(pTVar6,puVar10,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_01 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar9);
      *target = '\x1a';
      uVar8 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            puVar10 = puVar11 + 1;
            bVar4 = 0x3fff < uVar8;
            uVar8 = uVar7;
          } while (bVar4);
          *puVar11 = (uint8)uVar7;
        }
      }
      target = _InternalSerialize(this_01,puVar10,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                          (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar9);
      *target = '\"';
      uVar8 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            puVar10 = puVar11 + 1;
            bVar4 = 0x3fff < uVar8;
            uVar8 = uVar7;
          } while (bVar4);
          *puVar11 = (uint8)uVar7;
        }
      }
      target = EnumDescriptorProto::_InternalSerialize(this_02,puVar10,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_03 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                          (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar9);
      *target = '*';
      uVar8 = (this_03->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            puVar10 = puVar11 + 1;
            bVar4 = 0x3fff < uVar8;
            uVar8 = uVar7;
          } while (bVar4);
          *puVar11 = (uint8)uVar7;
        }
      }
      target = DescriptorProto_ExtensionRange::_InternalSerialize(this_03,puVar10,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->extension_).super_RepeatedPtrFieldBase,iVar9);
      *target = '2';
      uVar8 = (pTVar6->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            puVar10 = puVar11 + 1;
            bVar4 = 0x3fff < uVar8;
            uVar8 = uVar7;
          } while (bVar4);
          *puVar11 = (uint8)uVar7;
        }
      }
      target = FieldDescriptorProto::_InternalSerialize(pTVar6,puVar10,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  if ((uVar5 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->options_;
    *target = ':';
    uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar10 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar10 = target + 3;
      }
      else {
        puVar10 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar11 = puVar10;
          puVar11[-1] = (byte)uVar5 | 0x80;
          uVar8 = uVar5 >> 7;
          puVar10 = puVar11 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar8;
        } while (bVar4);
        *puVar11 = (uint8)uVar8;
      }
    }
    target = MessageOptions::_InternalSerialize(this_00,puVar10,stream);
  }
  iVar1 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_04 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                          (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar9);
      *target = 'B';
      uVar5 = (this_04->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar5 | 0x80;
            uVar8 = uVar5 >> 7;
            puVar10 = puVar11 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar8;
          } while (bVar4);
          *puVar11 = (uint8)uVar8;
        }
      }
      target = OneofDescriptorProto::_InternalSerialize(this_04,puVar10,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_05 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                          (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar9);
      *target = 'J';
      uVar5 = (this_05->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar5 | 0x80;
            uVar8 = uVar5 >> 7;
            puVar10 = puVar11 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar8;
          } while (bVar4);
          *puVar11 = (uint8)uVar8;
        }
      }
      target = DescriptorProto_ReservedRange::_InternalSerialize(this_05,puVar10,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  iVar1 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    iVar9 = 0;
    do {
      s = internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar9);
      internal::WireFormatLite::VerifyUtf8String
                ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
                 "google.protobuf.DescriptorProto.reserved_name");
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 'R';
        target[1] = (uint8)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,10,s,target);
      }
      iVar9 = iVar9 + 1;
    } while (iVar1 != iVar9);
  }
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar10 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8),target,stream
                        );
    return puVar10;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* DescriptorProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_field_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(2, this->_internal_field(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nested_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_nested_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_range_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(5, this->_internal_extension_range(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(6, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_oneof_decl_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(8, this->_internal_oneof_decl(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(9, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    target = stream->WriteString(10, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}